

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

void __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,ArrayBuffer<unsigned_char,_1UL,_1UL> *other)

{
  undefined1 local_30 [8];
  ArrayBuffer<unsigned_char,_1UL,_1UL> tmp;
  size_t storageSize;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *other_local;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *this_local;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  if (other->m_cap != 0) {
    tmp.m_cap = other->m_cap;
    ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_30,other->m_cap);
    ::deMemcpy((void *)local_30,other->m_ptr,(long)(int)tmp.m_cap);
    swap(this,(ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_30);
    ~ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_30);
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (const ArrayBuffer<T,Alignment,Stride>& other)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (other.m_cap)
	{
		// copy to temporary and swap to it

		const size_t	storageSize =	(other.m_cap - 1) * Stride + sizeof(T);
		ArrayBuffer		tmp				(other.m_cap);

		deMemcpy(tmp.m_ptr, other.m_ptr, (int)storageSize);
		swap(tmp);
	}
}